

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::AnimationLayer::AnimationLayer
          (AnimationLayer *this,uint64_t id,Element *element,string *name,Document *doc)

{
  Scope *sc;
  allocator<char> local_51;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationLayer_00821ae0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->doc = doc;
  sc = GetRequiredScope(element);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"AnimationLayer.FbxAnimLayer",&local_51);
  Util::GetPropertyTable((Util *)&local_50,doc,&local_40,element,sc,true);
  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
             &local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

AnimationLayer::AnimationLayer(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Object(id, element, name)
, doc(doc)
{
    const Scope& sc = GetRequiredScope(element);

    // note: the props table here bears little importance and is usually absent
    props = GetPropertyTable(doc,"AnimationLayer.FbxAnimLayer",element,sc, true);
}